

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::ValueIteratorBase::isEqual(ValueIteratorBase *this,SelfType *other)

{
  _Self *in_RSI;
  _Self *in_RDI;
  bool local_1;
  
  if (((ulong)in_RDI[1]._M_node & 1) == 0) {
    local_1 = std::operator==(in_RDI,in_RSI);
  }
  else {
    local_1 = (bool)(*(byte *)&in_RSI[1]._M_node & 1);
  }
  return local_1;
}

Assistant:

bool ValueIteratorBase::isEqual(const SelfType& other) const {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  if (isNull_) {
    return other.isNull_;
  }
  return current_ == other.current_;
#else
  if (isArray_)
    return ValueInternalArray::equals(iterator_.array_, other.iterator_.array_);
  return ValueInternalMap::equals(iterator_.map_, other.iterator_.map_);
#endif
}